

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

string * __thiscall
(anonymous_namespace)::percent_str_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,index_t num,index_t denom)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  ostringstream out;
  undefined8 *local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8;
  long lStack_1e0;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  long local_198;
  undefined8 local_190 [13];
  ios_base local_128 [264];
  
  if (num == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 0x11;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_198);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 0x11;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_1b8);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_1e8 = *puVar5;
    lStack_1e0 = plVar3[3];
    local_1f8 = &local_1e8;
  }
  else {
    local_1e8 = *puVar5;
    local_1f8 = (ulong *)*plVar3;
  }
  local_1f0 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 0x11;
  std::ostream::_M_insert<double>(((double)((ulong)this & 0xffffffff) / (double)num) * 100.0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  uVar7 = 0xf;
  if (local_1f8 != &local_1e8) {
    uVar7 = local_1e8;
  }
  if (uVar7 < (ulong)(local_1d0 + local_1f0)) {
    uVar7 = 0xf;
    if (local_1d8 != local_1c8) {
      uVar7 = local_1c8[0];
    }
    if ((ulong)(local_1d0 + local_1f0) <= uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_1f8);
      goto LAB_0013f5c5;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1d8);
LAB_0013f5c5:
  local_218 = &local_208;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_208 = *puVar1;
    uStack_200 = puVar4[3];
  }
  else {
    local_208 = *puVar1;
    local_218 = (undefined8 *)*puVar4;
  }
  local_210 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_218);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar6) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string percent_str(index_t num, index_t denom) {
        if(denom == 0) {
            return String::to_string(num);
        }
        double x = double(num) / double(denom) * 100.0;
        return String::to_string(num) + "(" + String::to_string(x) + "%)";
    }